

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_14fcaed::AV1Convolve2DIntraBCTest_DISABLED_SpeedTest_Test::TestBody
          (AV1Convolve2DIntraBCTest_DISABLED_SpeedTest_Test *this)

{
  uint src_stride;
  uint h;
  _func_void_uchar_ptr_int_uchar_ptr_int_int_int_InterpFilterParams_ptr_InterpFilterParams_ptr_int_int_ConvolveParams_ptr
  *p_Var1;
  ParamType *pPVar2;
  uint8_t *src;
  int64_t iVar3;
  int64_t iVar4;
  int iVar5;
  bool bVar6;
  aom_usec_timer timer;
  ConvolveParams conv_params_1;
  ConvolveParams conv_params;
  uint8_t test [16384];
  uint8_t reference [16384];
  aom_usec_timer local_80e0;
  ConvolveParams local_80c0;
  ConvolveParams local_8090;
  uchar local_8060 [16384];
  uint8_t local_4060 [16432];
  
  pPVar2 = testing::
           WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*)>_>
           ::GetParam();
  src_stride = (pPVar2->block_).width_;
  pPVar2 = testing::
           WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*)>_>
           ::GetParam();
  h = (pPVar2->block_).height_;
  pPVar2 = testing::
           WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*)>_>
           ::GetParam();
  src = AV1ConvolveTest<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*)>
        ::FirstRandomInput8((AV1ConvolveTest<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*)>
                             *)this,pPVar2);
  local_8090.is_compound = 0;
  local_8090.use_dist_wtd_comp_avg = 0;
  local_8090.dst = (CONV_BUF_TYPE *)0x0;
  local_8090.dst_stride = 0;
  local_8090.round_0 = 3;
  local_8090.round_1 = 0xb;
  local_8090.plane = 0;
  local_8090.do_average = 0;
  ::aom_usec_timer_start(&local_80e0);
  iVar5 = 10000;
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    av1_convolve_2d_sr_intrabc_c
              (src,src_stride,local_4060,0x80,src_stride,h,&av1_intrabc_filter_params,
               &av1_intrabc_filter_params,8,8,&local_8090);
  }
  ::aom_usec_timer_mark(&local_80e0);
  iVar3 = ::aom_usec_timer_elapsed(&local_80e0);
  pPVar2 = testing::
           WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*)>_>
           ::GetParam();
  p_Var1 = pPVar2->test_func_;
  local_80c0.is_compound = 0;
  local_80c0.use_dist_wtd_comp_avg = 0;
  local_80c0.dst = (CONV_BUF_TYPE *)0x0;
  local_80c0.dst_stride = 0;
  local_80c0.round_0 = 3;
  local_80c0.round_1 = 0xb;
  local_80c0.plane = 0;
  local_80c0.do_average = 0;
  ::aom_usec_timer_start(&local_80e0);
  iVar5 = 10000;
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    (*p_Var1)(src,src_stride,local_8060,0x80,src_stride,h,&av1_intrabc_filter_params,
              &av1_intrabc_filter_params,8,8,&local_80c0);
  }
  ::aom_usec_timer_mark(&local_80e0);
  iVar4 = ::aom_usec_timer_elapsed(&local_80e0);
  printf("%d - %d %3dx%-3d:%7.2f/%7.2fns (%3.2f)\n",SUB84((double)iVar3,0),(double)iVar4,
         (double)iVar3 / (double)iVar4,3,3,(ulong)src_stride,(ulong)h);
  return;
}

Assistant:

TEST_P(AV1Convolve2DIntraBCTest, DISABLED_SpeedTest) { SpeedTest(); }